

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
          (AssertionResult *__return_storage_ptr__,StrCaseNeHelper *this,char *expr1,char *expr2,
          wchar_t **val1,wchar_t **val2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wchar_t *__s1;
  wchar_t *__s2;
  pointer pcVar2;
  int iVar3;
  AssertionResult *pAVar4;
  wchar_t **v;
  wchar_t **v_00;
  bool bVar5;
  char *local_e0;
  StrCaseNeHelper *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  AssertionResult local_50;
  
  __s1 = *(wchar_t **)expr2;
  __s2 = *val1;
  local_e0 = expr1;
  local_d8 = this;
  if (__s1 == (wchar_t *)0x0 || __s2 == (wchar_t *)0x0) {
    bVar5 = __s1 == __s2;
  }
  else {
    iVar3 = wcscasecmp(__s1,__s2);
    bVar5 = iVar3 == 0;
  }
  if (bVar5) {
    paVar1 = &local_50.m_message.field_2;
    local_50.m_message._M_string_length = 0;
    local_50.m_message.field_2._M_local_buf[0] = '\0';
    local_50.m_result = false;
    local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = AssertionResult::operator<<(&local_50,(char (*) [18])"error: Expected: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,(char **)&local_d8);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [5])" != ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_e0);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [17])" (ignoring case)");
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [12])0x337e3d);
    PrintToString<wchar_t_const*>(&local_90,(iutest *)val1,v);
    detail::ShowStringQuoted(&local_70,&local_90);
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_70);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [5])" vs ");
    PrintToString<wchar_t_const*>(&local_d0,(iutest *)expr2,v_00);
    detail::ShowStringQuoted(&local_b0,&local_d0);
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_b0);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.m_message._M_dataplus._M_p,
                      CONCAT71(local_50.m_message.field_2._M_allocated_capacity._1_7_,
                               local_50.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(
    const char* expr1, const char* expr2
        , const T1& val1, const T2& val2)
{
    if IUTEST_COND_LIKELY( Compare(val1, val2) )
    {
        return AssertionSuccess();
    }

    return AssertionFailure() << "error: Expected: " << expr1 << " != " << expr2 << " (ignoring case)"
        << "\n  Actual: " << detail::ShowStringQuoted(FormatForComparisonFailureMessage(val2, val1))
        << " vs " << detail::ShowStringQuoted(FormatForComparisonFailureMessage(val1, val2));
}